

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section_helper.hpp
# Opt level: O0

unique_ptr<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>_>
 build_section<(pstore::repo::section_kind)0,pstore::repo::generic_section,pstore::repo::generic_section_creation_dispatcher>
           (not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> buffer,
           section_content *content)

{
  section_content *in_RDX;
  not_null<const_pstore::repo::section_content_*> local_40;
  undefined1 local_38 [8];
  generic_section_creation_dispatcher dispatcher;
  section_content *content_local;
  not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> buffer_local;
  
  pstore::gsl::not_null<const_pstore::repo::section_content_*>::not_null(&local_40,in_RDX);
  pstore::repo::generic_section_creation_dispatcher::generic_section_creation_dispatcher
            ((generic_section_creation_dispatcher *)local_38,text,local_40);
  dispatch_new_section<(pstore::repo::section_kind)0,pstore::repo::generic_section_creation_dispatcher>
            ((generic_section_creation_dispatcher *)buffer.ptr_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  pstore::repo::generic_section_creation_dispatcher::~generic_section_creation_dispatcher
            ((generic_section_creation_dispatcher *)local_38);
  return (__uniq_ptr_data<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>,_true,_true>
          )(__uniq_ptr_data<const_pstore::repo::generic_section,_placement_delete<const_pstore::repo::generic_section>,_true,_true>
            )buffer.ptr_;
}

Assistant:

decltype (auto) build_section (pstore::gsl::not_null<std::vector<std::uint8_t> *> const buffer,
                               pstore::repo::section_content const & content) {
    CreationDispatcher dispatcher{Kind, &content};
    return dispatch_new_section<Kind> (dispatcher, buffer);
}